

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O3

void dump_dfg_gml(EVdfg_configuration state)

{
  FILE *__stream;
  ulong in_RAX;
  EVdfg_stone_state p_Var1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  __stream = _stdout;
  fputs("<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<!-- This file was written by the JAVA GraphML Library.-->\n<graphml\n xmlns=\"http://graphml.graphdrawing.org/xmlns\"\n xmlns:xsi=\"http://www.w3.org/2001/XMLSchema-instance\"\n xmlns:y=\"http://www.yworks.com/xml/graphml\"\n xmlns:yed=\"http://www.yworks.com/xml/yed/3\"\n xsi:schemaLocation=\"http://graphml.graphdrawing.org/xmlns http://www.yworks.com/xml/schema/graphml/1.1/ygraphml.xsd\">\n  <key id=\"d0\" for=\"node\" attr.name=\"color\" attr.type=\"string\">\n    <default>yellow</default>\n  </key>\n  <key for=\"node\" id=\"d1\" yfiles.type=\"nodegraphics\"/>\n  <graph id=\"G\" edgedefault=\"directed\">\n"
        ,_stdout);
  if (0 < state->stone_count) {
    uVar2 = 0;
    do {
      fprintf(__stream,"<node id=\"n%d\" name=\"stone%d\">\n",uVar2 & 0xffffffff,uVar2 & 0xffffffff)
      ;
      if (0 < state->stones[uVar2]->out_count) {
        uVar4 = 0;
        do {
          fprintf(__stream,"<port name=\"P%d\"/>\n",uVar4);
          uVar3 = (int)uVar4 + 1;
          uVar4 = (ulong)uVar3;
        } while ((int)uVar3 < state->stones[uVar2]->out_count);
      }
      fprintf(__stream,
              "      <data key=\"d1\">\n        <y:ShapeNode>\n            <y:NodeLabel>S%d</y:NodeLabel>                    <!-- label text -->\n        </y:ShapeNode>\n      </data>\n"
              ,uVar2 & 0xffffffff);
      fwrite("</node>\n",8,1,__stream);
      p_Var1 = state->stones[uVar2];
      if (0 < p_Var1->out_count) {
        uVar4 = 0;
        do {
          in_RAX = CONCAT44((int)(in_RAX >> 0x20),p_Var1->out_links[uVar4]) & 0xffffffff7fffffff;
          fprintf(__stream,"<edge id=\"n%de%d\" source=\"n%d\" sourceport=\"P%d\" target=\"n%d\">\n"
                  ,uVar2 & 0xffffffff,(ulong)(p_Var1->out_links[uVar4] & 0x7fffffff),
                  uVar2 & 0xffffffff,uVar4 & 0xffffffff,in_RAX);
          fwrite("</edge>\n",8,1,__stream);
          uVar4 = uVar4 + 1;
          p_Var1 = state->stones[uVar2];
        } while ((long)uVar4 < (long)p_Var1->out_count);
      }
      uVar2 = uVar2 + 1;
    } while ((long)uVar2 < (long)state->stone_count);
  }
  fwrite("</graph>\n</graphml>\n",0x14,1,__stream);
  return;
}

Assistant:

static void
dump_dfg_gml(EVdfg_configuration state)
{
    fdump_dfg_gml(stdout, state);
}